

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

int Js::TaggedInt::ToBuffer(int value,char16 *buffer,uint bufSize)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  
  if (bufSize < 0x16) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x1e3,"(bufSize >= 22)","bufSize >= 22");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar2 = -value;
  if (0 < value) {
    uVar2 = value;
  }
  iVar4 = UnsignedToString((ulong)uVar2,buffer,bufSize);
  if (value < 0) {
    iVar4 = iVar4 + -1;
    buffer[iVar4] = L'-';
  }
  return iVar4;
}

Assistant:

int TaggedInt::ToBuffer(int value, __out_ecount_z(bufSize) char16 * buffer, uint bufSize)
    {
        Assert(bufSize >= 22);
        return SignedToString(value, buffer, bufSize);
    }